

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O2

void __thiscall glu::Program::Program(Program *this,Functions *gl)

{
  GLuint GVar1;
  GLenum err;
  
  this->m_gl = gl;
  this->m_program = 0;
  (this->m_info).infoLog._M_dataplus._M_p = (pointer)&(this->m_info).infoLog.field_2;
  (this->m_info).infoLog._M_string_length = 0;
  (this->m_info).infoLog.field_2._M_local_buf[0] = '\0';
  (this->m_info).linkOk = false;
  (this->m_info).linkTimeUs = 0;
  GVar1 = (*gl->createProgram)();
  this->m_program = GVar1;
  err = (*this->m_gl->getError)();
  checkError(err,"glCreateProgram()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluShaderProgram.cpp"
             ,0xbc);
  return;
}

Assistant:

Program::Program (const glw::Functions& gl)
	: m_gl		(gl)
	, m_program	(0)
{
	m_program = m_gl.createProgram();
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCreateProgram()");
}